

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v256_intrinsics_c.h
# Opt level: O1

c_v256 * c_v256_madd_s16(c_v256 a,c_v256 b)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  c_v256 cVar3;
  c_v256 *in_RDI;
  undefined1 auVar4 [16];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [16];
  
  auVar2 = vshufps_avx((undefined1  [16])a.v128[0],(undefined1  [16])a.v128[1],0x88);
  auVar4 = vshufps_avx((undefined1  [16])b.v128[0],(undefined1  [16])b.v128[1],0x88);
  auVar1 = vpmaddwd_avx(auVar4,auVar2);
  auVar5 = vpsrlq_avx2((undefined1  [32])a,0x10);
  auVar2 = vshufps_avx(auVar5._0_16_,auVar5._16_16_,0x88);
  auVar5 = vpsrlq_avx2((undefined1  [32])b,0x10);
  auVar4 = vshufps_avx(auVar5._0_16_,auVar5._16_16_,0x88);
  auVar7 = vpsrld_avx(auVar4,0x10);
  auVar4 = vpsrld_avx(auVar2,0x10);
  auVar2 = vshufps_avx((undefined1  [16])a.v128[0],(undefined1  [16])a.v128[1],0xdd);
  auVar2 = vpblendw_avx(auVar4,auVar2,0xaa);
  auVar4 = vshufps_avx((undefined1  [16])b.v128[0],(undefined1  [16])b.v128[1],0xdd);
  auVar4 = vpblendw_avx(auVar7,auVar4,0xaa);
  auVar2 = vpmaddwd_avx(auVar4,auVar2);
  auVar5 = vpmovzxdq_avx2(auVar2);
  auVar6 = vpsllq_avx2(auVar5,0x20);
  auVar5 = vpmovzxdq_avx2(auVar1);
  cVar3 = (c_v256)vpblendd_avx2(auVar5,auVar6,0xaa);
  *in_RDI = cVar3;
  return in_RDI;
}

Assistant:

SIMD_INLINE c_v256 c_v256_madd_s16(c_v256 a, c_v256 b) {
  return c_v256_from_v128(c_v128_madd_s16(a.v128[1], b.v128[1]),
                          c_v128_madd_s16(a.v128[0], b.v128[0]));
}